

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindWindowSettingsByWindow(ImGuiWindow *window)

{
  ImGuiWindowSettings *pIVar1;
  long in_RDI;
  ImGuiContext *g;
  undefined8 in_stack_fffffffffffffff8;
  
  if (*(int *)(in_RDI + 0x2ac) == -1) {
    pIVar1 = FindWindowSettingsByID((ImGuiID)((ulong)in_stack_fffffffffffffff8 >> 0x20));
  }
  else {
    pIVar1 = ImChunkStream<ImGuiWindowSettings>::ptr_from_offset
                       (&GImGui->SettingsWindows,*(int *)(in_RDI + 0x2ac));
  }
  return pIVar1;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettingsByWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->SettingsOffset != -1)
        return g.SettingsWindows.ptr_from_offset(window->SettingsOffset);
    return FindWindowSettingsByID(window->ID);
}